

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O1

bool __thiscall
tinyusdz::AssetResolutionResolver::open_asset
          (AssetResolutionResolver *this,string *resolvedPath,string *assetPath,Asset *asset_out,
          string *warn,string *err)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
  *this_00;
  void *pvVar1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  pointer puVar5;
  bool bVar6;
  uint64_t sz;
  uint64_t read_size;
  string ext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint64_t local_e0;
  void *local_d8;
  uint64_t local_d0;
  string local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (asset_out == (Asset *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x3c7b06);
      return false;
    }
    return false;
  }
  io::GetFileExtension(&local_c8,resolvedPath);
  this_00 = &this->_asset_resolution_handlers;
  cVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
          ::find(&this_00->_M_t,&local_c8);
  if ((((_Rb_tree_header *)cVar3._M_node ==
        &(this->_asset_resolution_handlers)._M_t._M_impl.super__Rb_tree_header) ||
      (pmVar4 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                ::at(this_00,&local_c8), pmVar4->size_fun == (FSSizeAsset)0x0)) ||
     (pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::at(this_00,&local_c8), pmVar4->read_fun == (FSReadAsset)0x0)) {
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = io::ReadWholeFile(&local_a8,err,resolvedPath,this->_max_asset_bytes_in_mb << 0x14,
                              (void *)0x0);
    if (bVar6) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_out->buf_,&local_a8
                );
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    if ((pointer *)
        local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer *)0x0) goto LAB_00322f58;
    puVar5 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage +
             -(long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_c8);
    pvVar1 = pmVar4->userdata;
    local_e0 = 0;
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_c8);
    local_d8 = pvVar1;
    iVar2 = (*pmVar4->size_fun)((resolvedPath->_M_dataplus)._M_p,&local_e0,err,pvVar1);
    if (iVar2 != 0) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
      bVar6 = false;
      goto LAB_00322f58;
    }
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_88 = &local_78;
    local_80 = 0;
    local_78 = 0;
    local_68 = &local_58;
    local_60 = 0;
    local_58 = 0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,local_e0);
    local_d0 = 0;
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
             ::at(this_00,&local_c8);
    iVar2 = (*pmVar4->read_fun)((resolvedPath->_M_dataplus)._M_p,
                                (long)local_48.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,&local_d0,err,local_d8);
    bVar6 = iVar2 == 0;
    if (bVar6) {
      if (local_d0 < local_e0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,local_d0);
      }
      ::std::__cxx11::string::operator=((string *)asset_out,(string *)&local_a8);
      ::std::__cxx11::string::operator=((string *)&asset_out->name_,(string *)&local_88);
      ::std::__cxx11::string::operator=((string *)&asset_out->resolved_name_,(string *)&local_68);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_out->buf_,&local_48
                );
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if ((pointer *)
        local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        &local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) goto LAB_00322f58;
    puVar5 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 1;
  }
  operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,(ulong)puVar5);
LAB_00322f58:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool AssetResolutionResolver::open_asset(const std::string &resolvedPath, const std::string &assetPath,
                  Asset *asset_out, std::string *warn, std::string *err) const {

  if (!asset_out) {
    if (err) {
      (*err) = "`asset` arg is nullptr.";
    }
    return false;
  }

  DCOUT("Opening asset: " << resolvedPath);

  (void)assetPath;
  (void)warn;

  std::string ext = io::GetFileExtension(resolvedPath);

  if (_asset_resolution_handlers.count(ext)) {
    if (_asset_resolution_handlers.at(ext).size_fun && _asset_resolution_handlers.at(ext).read_fun) {

      // Use custom handler's userdata
      void *userdata = _asset_resolution_handlers.at(ext).userdata;

      // Get asset size.
      uint64_t sz{0};
      int ret = _asset_resolution_handlers.at(ext).size_fun(resolvedPath.c_str(), &sz, err, userdata);
      if (ret != 0) {
        if (err) {
          (*err) += "Get size of asset through handler failed.\n";
        }
        return false;
      }
    
      DCOUT("asset_size: " << sz);

      tinyusdz::Asset asset;
      asset.resize(size_t(sz));

      uint64_t read_size{0};

      ret = _asset_resolution_handlers.at(ext).read_fun(resolvedPath.c_str(), /* req_size */asset.size(), asset.data(), &read_size, err, userdata);

      if (ret != 0) {
        if (err) {
          (*err) += "Read asset through handler failed.\n";
        }
        return false;
      }

      if (read_size < sz) {
        asset.resize(size_t(read_size));
        // May optimize memory usage
        asset.shrink_to_fit();
      }

      (*asset_out) = std::move(asset);

      return true;
    } else {
      DCOUT("Resolve function is nullptr. Fallback to built-in file handler.");
    }
  }

  // Default: read from a file.
  std::vector<uint8_t> data;
  size_t max_bytes = 1024 * 1024 * _max_asset_bytes_in_mb;
  if (!io::ReadWholeFile(&data, err, resolvedPath, max_bytes,
                           /* userdata */ nullptr)) {

    if (err) {
      (*err) += "Open asset from a file failed.\n";
    }

    return false;
  }

  asset_out->set_data(std::move(data));

  return true;
}